

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ReusableStringStream::~ReusableStringStream(ReusableStringStream *this)

{
  string *psVar1;
  StringStreams *this_00;
  NonCopyable *in_RDI;
  size_t in_stack_ffffffffffffffa8;
  allocator local_29;
  string local_28 [40];
  
  in_RDI->_vptr_NonCopyable = (_func_int **)&PTR__ReusableStringStream_00294e60;
  psVar1 = (string *)in_RDI[2]._vptr_NonCopyable;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"",&local_29);
  std::__cxx11::ostringstream::str(psVar1);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::ios::clear((long)in_RDI[2]._vptr_NonCopyable +
                  *(long *)(*in_RDI[2]._vptr_NonCopyable + -0x18),0);
  this_00 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getMutable
                      ();
  StringStreams::release(this_00,in_stack_ffffffffffffffa8);
  NonCopyable::~NonCopyable(in_RDI);
  return;
}

Assistant:

ReusableStringStream::~ReusableStringStream() {
        static_cast<std::ostringstream*>( m_oss )->str("");
        m_oss->clear();
        Singleton<StringStreams>::getMutable().release( m_index );
    }